

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string output;
  string input;
  string macdir;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar2) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              (&local_50,
               (this->Generator->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc);
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + psVar3->_M_string_length);
    pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar4,&local_d0);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    cmsys::SystemTools::GetFilenameName(&local_70,&local_d0);
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar4,&local_f0);
    std::__cxx11::string::_M_assign((string *)&local_f0);
    pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar4,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->Generator->ExtraFiles,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(input,
                                                                 output);

  // Add as a dependency to the target so that it gets called.
  this->Generator->ExtraFiles.push_back(std::move(output));
}